

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::ListFields
          (Reflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  pointer *pppFVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Descriptor *pDVar5;
  FieldDescriptor *pFVar6;
  pointer ppFVar7;
  pointer ppFVar8;
  int iVar9;
  uint32_t uVar10;
  Nonnull<const_char_*> pcVar11;
  pointer ppFVar12;
  bool bVar13;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  ulong uVar14;
  long lVar15;
  iterator iVar16;
  pointer ppFVar17;
  uint uVar18;
  uint uVar19;
  FieldDescriptor *pFVar20;
  long lVar21;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i_1;
  FieldDescriptor *local_60 [2];
  uint32_t *local_50;
  ReflectionSchema *local_48;
  ulong local_40;
  uint32_t *local_38;
  
  ppFVar17 = (output->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((output->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar17) {
    (output->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar17;
  }
  if ((this->schema_).default_instance_ != message) {
    if ((this->schema_).has_bits_offset_ == -1) {
      local_50 = (uint32_t *)0x0;
    }
    else {
      local_50 = GetHasBits(this,message);
    }
    uVar18 = 0;
    local_48 = &this->schema_;
    local_38 = (this->schema_).has_bit_indices_;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve(output,(long)this->descriptor_->field_count_);
    local_40 = (ulong)(uint)this->last_non_weak_field_index_;
    if (-1 < this->last_non_weak_field_index_) {
      local_40 = local_40 + 1;
      uVar14 = 0;
      lVar21 = 0x28;
      uVar18 = 0;
      do {
        pDVar5 = this->descriptor_;
        lVar15 = (long)pDVar5->field_count_;
        if ((long)uVar14 < lVar15) {
          pcVar11 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (uVar14,lVar15,"index < field_count()");
        }
        if (pcVar11 != (Nonnull<const_char_*>)0x0) goto LAB_001f1ae2;
        pFVar6 = pDVar5->fields_;
        bVar2 = *(byte *)((long)pFVar6 + lVar21 + -0x27);
        bVar13 = (bool)((bVar2 & 0x20) >> 5);
        if (0xbf < bVar2 == bVar13) {
          pcVar11 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar13,0xbf < bVar2,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar11 != (Nonnull<const_char_*>)0x0) goto LAB_001f1ad5;
        pFVar20 = (FieldDescriptor *)((long)pFVar6 + lVar21 + -0x28);
        bVar2 = *(byte *)((long)pFVar6 + lVar21 + -0x27);
        if ((bVar2 & 0x20) == 0) {
          if ((bVar2 & 0x10) == 0) {
            lVar15 = 0;
          }
          else {
            lVar15 = *(long *)(&pFVar6->super_SymbolBase + lVar21);
            if (lVar15 == 0) goto LAB_001f1aef;
          }
          bVar13 = internal::ReflectionSchema::InRealOneof(local_48,pFVar20);
          if (bVar13) {
            if ((ulong)*(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                                (long)((int)((ulong)(lVar15 - *(long *)(*(long *)(lVar15 + 0x10) +
                                                                       0x48)) >> 3) * -0x49249249) *
                                4 + (ulong)(uint)(this->schema_).oneof_case_offset_) ==
                (long)*(int *)((long)pFVar6 + lVar21 + -0x24)) {
              uVar19 = *(uint *)((long)pFVar6 + lVar21 + -0x24);
              if (uVar19 < uVar18) {
                uVar19 = 0xffffffff;
              }
              iVar16._M_current =
                   (output->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar16._M_current ==
                  (output->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001f17d4;
LAB_001f184f:
              *iVar16._M_current = pFVar20;
              pppFVar1 = &(output->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppFVar1 = *pppFVar1 + 1;
              local_60[0] = pFVar20;
              uVar18 = uVar19;
            }
          }
          else {
            if ((local_50 == (uint32_t *)0x0) || (local_38[uVar14] == 0xffffffff)) {
              bVar13 = HasFieldSingular(this,message,pFVar20);
            }
            else {
              bVar13 = IsFieldPresentGivenHasbits(this,message,pFVar20,local_50,local_38[uVar14]);
            }
            if (bVar13 != false) {
              uVar19 = *(uint *)((long)pFVar6 + lVar21 + -0x24);
              if (uVar19 < uVar18) {
                uVar19 = 0xffffffff;
              }
              iVar16._M_current =
                   (output->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar16._M_current !=
                  (output->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001f184f;
LAB_001f17d4:
              local_60[0] = pFVar20;
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)output,iVar16,local_60);
              uVar18 = uVar19;
            }
          }
        }
        else {
          iVar9 = FieldSize(this,message,pFVar20);
          if (0 < iVar9) {
            uVar19 = *(uint *)((long)pFVar6 + lVar21 + -0x24);
            if (uVar19 < uVar18) {
              uVar19 = 0xffffffff;
            }
            iVar16._M_current =
                 (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            uVar18 = uVar19;
            if (iVar16._M_current ==
                (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_60[0] = pFVar20;
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)output,iVar16,local_60);
            }
            else {
              *iVar16._M_current = pFVar20;
              pppFVar1 = &(output->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppFVar1 = *pppFVar1 + 1;
              local_60[0] = pFVar20;
            }
          }
        }
        uVar14 = uVar14 + 1;
        lVar21 = lVar21 + 0x58;
      } while (local_40 != uVar14);
    }
    if (uVar18 == 0xffffffff) {
      ppFVar17 = (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppFVar7 = (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (ppFVar17 != ppFVar7) {
        uVar14 = (long)ppFVar7 - (long)ppFVar17 >> 3;
        lVar21 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar21 == 0; lVar21 = lVar21 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar17,ppFVar7,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)ppFVar7 - (long)ppFVar17 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                    (ppFVar17,ppFVar7);
        }
        else {
          ppFVar12 = ppFVar17 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                    (ppFVar17,ppFVar12);
          for (; ppFVar12 != ppFVar7; ppFVar12 = ppFVar12 + 1) {
            pFVar6 = ppFVar12[-1];
            pFVar20 = *ppFVar12;
            iVar3 = pFVar20->number_;
            iVar9 = pFVar6->number_;
            ppFVar17 = ppFVar12;
            while (iVar3 < iVar9) {
              *ppFVar17 = pFVar6;
              pFVar6 = ppFVar17[-2];
              ppFVar17 = ppFVar17 + -1;
              iVar9 = pFVar6->number_;
            }
            *ppFVar17 = pFVar20;
          }
        }
      }
      uVar18 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1]->number_;
    }
    uVar19 = uVar18;
    if ((this->schema_).extensions_offset_ != -1) {
      lVar21 = (long)(output->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(output->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = internal::ReflectionSchema::GetExtensionSetOffset(local_48);
      internal::ExtensionSet::AppendToList
                ((ExtensionSet *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar10),
                 this->descriptor_,this->descriptor_pool_,output);
      ppFVar17 = (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppFVar7 = (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      ppFVar12 = ppFVar7;
      if ((pointer)((long)ppFVar17 + lVar21) != ppFVar7) {
        ppFVar8 = (pointer)(lVar21 + (long)ppFVar17);
        do {
          ppFVar12 = ppFVar8 + 1;
          if (ppFVar12 == ppFVar7) break;
          pFVar6 = *ppFVar8;
          ppFVar8 = ppFVar12;
        } while (pFVar6->number_ <= (*ppFVar12)->number_);
      }
      if (ppFVar12 != ppFVar7) {
        ListFields();
        goto LAB_001f1acb;
      }
      if ((long)ppFVar7 - (long)ppFVar17 != lVar21) {
        uVar4 = (*(pointer)((long)ppFVar17 + lVar21))->number_;
        uVar19 = 0xffffffff;
        if (uVar18 <= uVar4) {
          uVar19 = uVar4;
        }
      }
    }
    ppFVar17 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppFVar7 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (uVar19 == 0xffffffff) {
      if (ppFVar17 != ppFVar7) {
        uVar14 = (long)ppFVar7 - (long)ppFVar17 >> 3;
        lVar21 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar21 == 0; lVar21 = lVar21 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar17,ppFVar7,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)ppFVar7 - (long)ppFVar17 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                    (ppFVar17,ppFVar7);
        }
        else {
          ppFVar12 = ppFVar17 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                    (ppFVar17,ppFVar12);
          for (; ppFVar12 != ppFVar7; ppFVar12 = ppFVar12 + 1) {
            pFVar6 = ppFVar12[-1];
            pFVar20 = *ppFVar12;
            iVar3 = pFVar20->number_;
            iVar9 = pFVar6->number_;
            ppFVar17 = ppFVar12;
            while (iVar3 < iVar9) {
              *ppFVar17 = pFVar6;
              pFVar6 = ppFVar17[-2];
              ppFVar17 = ppFVar17 + -1;
              iVar9 = pFVar6->number_;
            }
            *ppFVar17 = pFVar20;
          }
        }
      }
    }
    else {
      ppFVar12 = ppFVar7;
      if (ppFVar17 != ppFVar7) {
        do {
          ppFVar12 = ppFVar17 + 1;
          if (ppFVar12 == ppFVar7) break;
          pFVar6 = *ppFVar17;
          ppFVar17 = ppFVar12;
        } while (pFVar6->number_ <= (*ppFVar12)->number_);
      }
      if (ppFVar12 != ppFVar7) {
LAB_001f1acb:
        ListFields();
LAB_001f1ad5:
        ListFields();
LAB_001f1ae2:
        ListFields();
LAB_001f1aef:
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
    }
  }
  return;
}

Assistant:

void Reflection::ListFields(const Message& message,
                            std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticeable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32_t* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : nullptr;
  const uint32_t* const has_bits_indices = schema_.has_bit_indices_;
  output->reserve(descriptor_->field_count());
  const int last_non_weak_field_index = last_non_weak_field_index_;
  // Fields in messages are usually added with the increasing tags.
  uint32_t last = 0;  // UINT32_MAX if out-of-order
  auto append_to_output = [&last, &output](const FieldDescriptor* field) {
    CheckInOrder(field, &last);
    output->push_back(field);
  };
  for (int i = 0; i <= last_non_weak_field_index; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        append_to_output(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (schema_.InRealOneof(field)) {
        const uint32_t* const oneof_case_array =
            GetConstPointerAtOffset<uint32_t>(&message,
                                              schema_.oneof_case_offset_);
        // Equivalent to: HasOneofField(message, field)
        if (static_cast<int64_t>(oneof_case_array[containing_oneof->index()]) ==
            field->number()) {
          append_to_output(field);
        }
      } else if (has_bits && has_bits_indices[i] != static_cast<uint32_t>(-1)) {
        // Equivalent to: HasFieldSingular(message, field)
        if (IsFieldPresentGivenHasbits(message, field, has_bits,
                                       has_bits_indices[i])) {
          append_to_output(field);
        }
      } else if (HasFieldSingular(message, field)) {
        // Fall back on proto3-style HasBit.
        append_to_output(field);
      }
    }
  }
  // Descriptors of ExtensionSet are appended in their increasing tag
  // order and they are usually bigger than the field tags so if all fields are
  // not sorted, let them be sorted.
  if (last == UINT32_MAX) {
    std::sort(output->begin(), output->end(), FieldNumberSorter());
    last = output->back()->number();
  }
  size_t last_size = output->size();
  if (schema_.HasExtensionSet()) {
    // Descriptors of ExtensionSet are appended in their increasing order.
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
    ABSL_DCHECK(std::is_sorted(output->begin() + last_size, output->end(),
                               FieldNumberSorter()));
    if (output->size() != last_size) {
      CheckInOrder((*output)[last_size], &last);
    }
  }
  if (last != UINT32_MAX) {
    ABSL_DCHECK(
        std::is_sorted(output->begin(), output->end(), FieldNumberSorter()));
  } else {
    // ListFields() must sort output by field number.
    std::sort(output->begin(), output->end(), FieldNumberSorter());
  }
}